

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9FFTest(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  Abc_Frame_t *pAVar3;
  int iVar4;
  uint uVar5;
  FILE *pFVar6;
  char *pcVar7;
  char *pcVar8;
  Gia_Man_t *pG;
  Bmc_ParFf_t Pars;
  Gia_Man_t *pGold;
  Bmc_ParFf_t local_90;
  char *local_48;
  Gia_Man_t *local_40;
  Abc_Frame_t *local_38;
  
  local_40 = (Gia_Man_t *)0x0;
  local_38 = pAbc;
  Gia_ParFfSetDefault(&local_90);
  local_48 = (char *)0x0;
  Extra_UtilGetoptReset();
LAB_0022f24f:
  while (iVar4 = Extra_UtilGetopt(argc,argv,"ATNKSGkbsfdeunvh"), iVar2 = globalUtilOptind,
        0x61 < iVar4) {
    switch(iVar4) {
    case 0x62:
      local_90.fBasic = local_90.fBasic ^ 1;
      break;
    default:
      goto switchD_0022f274_caseD_63;
    case 100:
      local_90.fDump = local_90.fDump ^ 1;
      break;
    case 0x65:
      local_90.fDumpDelay = local_90.fDumpDelay ^ 1;
      break;
    case 0x66:
      local_90.fFfOnly = local_90.fFfOnly ^ 1;
      break;
    case 0x6b:
      local_90.fNonStrict = local_90.fNonStrict ^ 1;
      break;
    case 0x6e:
      local_90.fDumpNewFaults = local_90.fDumpNewFaults ^ 1;
      break;
    case 0x73:
      local_90.fStartPats = local_90.fStartPats ^ 1;
      break;
    case 0x75:
      local_90.fDumpUntest = local_90.fDumpUntest ^ 1;
      break;
    case 0x76:
      local_90.fVerbose = local_90.fVerbose ^ 1;
    }
  }
  if (iVar4 < 0x4b) {
    if (iVar4 == 0x41) {
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-A\" should be followed by an integer.\n";
        goto LAB_0022f432;
      }
      local_90.Algo = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar2 + 1;
      if (4 < (uint)local_90.Algo) goto switchD_0022f274_caseD_63;
      goto LAB_0022f24f;
    }
    if (iVar4 != 0x47) {
      if (iVar4 == -1) {
        if (local_90.pFormStr == (char *)0x0 && local_90.Algo == 0) {
          pcVar7 = "Formula string (-S <str>) should be selected when algorithm is 0 (-A 0).\n";
        }
        else if (local_90.Algo == 0 || local_90.pFormStr == (char *)0x0) {
          if (globalUtilOptind + 1 == argc) {
            local_90.pFileName = argv[globalUtilOptind];
            pFVar6 = fopen(local_90.pFileName,"r");
            if (pFVar6 == (FILE *)0x0) {
              Abc_Print(-1,"Cannot open file \"%s\" with the input test patterns.\n",
                        local_90.pFileName);
              return 0;
            }
            fclose(pFVar6);
          }
          pAVar3 = local_38;
          pcVar7 = local_48;
          if (local_38->pGia == (Gia_Man_t *)0x0) {
            pcVar7 = "Abc_CommandAbc9FFTest(): There is no AIG.\n";
          }
          else {
            if ((local_38->pGia->nRegs != 0) || (local_90.Algo != 1)) {
              if (local_48 == (char *)0x0) {
LAB_0022f901:
                pGVar1 = pAVar3->pGia;
                pG = local_40;
                if (local_40 == (Gia_Man_t *)0x0) {
                  pG = pGVar1;
                }
                Gia_ManFaultTest(pGVar1,pG,&local_90);
                Gia_ManStopP(&local_40);
                return 0;
              }
              pFVar6 = fopen(local_48,"r");
              if (pFVar6 == (FILE *)0x0) {
                pcVar8 = "Abc_CommandAbc9FFTest(): File name \"%s\" with golden model is invalid.\n"
                ;
              }
              else {
                fclose(pFVar6);
                local_40 = Gia_AigerRead(pcVar7,0,0);
                if (local_40 != (Gia_Man_t *)0x0) {
                  pGVar1 = pAVar3->pGia;
                  if (pGVar1->vCis->nSize - pGVar1->nRegs == local_40->vCis->nSize - local_40->nRegs
                     ) {
                    if (pGVar1->vCos->nSize - pGVar1->nRegs ==
                        local_40->vCos->nSize - local_40->nRegs) {
                      printf("Entered spec AIG from file \"%s\".\n",pcVar7);
                      goto LAB_0022f901;
                    }
                    Gia_ManStop(local_40);
                    pcVar7 = 
                    "Abc_CommandAbc9FFTest(): Old model and gold model have different number of POs.\n"
                    ;
                  }
                  else {
                    Gia_ManStop(local_40);
                    pcVar7 = 
                    "Abc_CommandAbc9FFTest(): Old model and gold model have different number of PIs.\n"
                    ;
                  }
                  goto LAB_0022f857;
                }
                pcVar8 = "Abc_CommandAbc9FFTest(): Cannot read file \"%s\" with golden model.\n";
                local_40 = (Gia_Man_t *)0x0;
              }
              Abc_Print(-1,pcVar8,pcVar7);
              return 0;
            }
            pcVar7 = "Abc_CommandAbc9FFTest(): For delay testing, AIG should be sequential.\n";
          }
        }
        else {
          pcVar7 = "Algorithm should be 0 (-A 0) when formula string is selected (-S <str>).\n";
        }
LAB_0022f857:
        Abc_Print(-1,pcVar7);
        return 0;
      }
      goto switchD_0022f274_caseD_63;
    }
    if (globalUtilOptind < argc) {
      local_48 = argv[globalUtilOptind];
      goto LAB_0022f303;
    }
    pcVar7 = "Command line switch \"-G\" should be followed by string.\n";
  }
  else {
    switch(iVar4) {
    case 0x4b:
      if (globalUtilOptind < argc) {
        local_90.nCardConstr = atoi(argv[globalUtilOptind]);
        globalUtilOptind = iVar2 + 1;
        if (local_90.nCardConstr < 1) goto switchD_0022f274_caseD_63;
        goto LAB_0022f24f;
      }
      pcVar7 = "Command line switch \"-K\" should be followed by an integer.\n";
      break;
    default:
      goto switchD_0022f274_caseD_63;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-N\" should be followed by an integer.\n";
        break;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      local_90.nIterCheck = uVar5;
LAB_0022f340:
      globalUtilOptind = iVar2 + 1;
      if ((int)uVar5 < 0) {
switchD_0022f274_caseD_63:
        Abc_Print(-2,"usage: &fftest [-ATNK num] [-kbsfdeunvh] <file> [-G file] [-S str]\n");
        Abc_Print(-2,"\t          performs functional fault test generation\n");
        Abc_Print(-2,"\t-A num  : selects fault model for all gates [default = %d]\n",
                  (ulong)(uint)local_90.Algo);
        Abc_Print(-2,"\t                0: fault model is not selected (use -S str)\n");
        Abc_Print(-2,"\t                1: delay fault testing for sequential circuits\n");
        Abc_Print(-2,"\t                2: traditional stuck-at fault: -S (((a&b)&~p)|q)\n");
        Abc_Print(-2,"\t                3: complement fault: -S ((a&b)^p)\n");
        Abc_Print(-2,"\t                4: functionally observable fault\n");
        Abc_Print(-2,"\t-T num  : specifies approximate runtime limit in seconds [default = %d]\n",
                  (ulong)(uint)local_90.nTimeOut);
        Abc_Print(-2,
                  "\t-N num  : specifies iteration to check for fixed parameters [default = %d]\n",
                  (ulong)(uint)local_90.nIterCheck);
        Abc_Print(-2,"\t-K num  : specifies cardinality constraint (num > 0) [default = unused]\n");
        pcVar8 = "yes";
        pcVar7 = "yes";
        if (local_90.fNonStrict == 0) {
          pcVar7 = "no";
        }
        Abc_Print(-2,
                  "\t-k      : toggles non-strict cardinality (n <= K, instead of n == K) [default = %s]\n"
                  ,pcVar7);
        pcVar7 = "yes";
        if (local_90.fBasic == 0) {
          pcVar7 = "no";
        }
        Abc_Print(-2,
                  "\t-b      : toggles testing for single faults (the same as \"-K 1\") [default = %s]\n"
                  ,pcVar7);
        pcVar7 = "yes";
        if (local_90.fStartPats == 0) {
          pcVar7 = "no";
        }
        Abc_Print(-2,
                  "\t-s      : toggles starting with the all-0 and all-1 patterns [default = %s]\n",
                  pcVar7);
        pcVar7 = "yes";
        if (local_90.fFfOnly == 0) {
          pcVar7 = "no";
        }
        Abc_Print(-2,
                  "\t-f      : toggles faults at flop inputs only with \"-A 1\" and \"-S str\" [default = %s]\n"
                  ,pcVar7);
        pcVar7 = "yes";
        if (local_90.fDump == 0) {
          pcVar7 = "no";
        }
        Abc_Print(-2,
                  "\t-d      : toggles dumping test patterns into file \"tests.txt\" [default = %s]\n"
                  ,pcVar7);
        pcVar7 = "yes";
        if (local_90.fDumpDelay == 0) {
          pcVar7 = "no";
        }
        Abc_Print(-2,
                  "\t-e      : toggles dumping test pattern pairs (delay faults only) [default = %s]\n"
                  ,pcVar7);
        pcVar7 = "yes";
        if (local_90.fDumpUntest == 0) {
          pcVar7 = "no";
        }
        Abc_Print(-2,
                  "\t-u      : toggles dumping untestable faults into \"untest.txt\" [default = %s]\n"
                  ,pcVar7);
        pcVar7 = "yes";
        if (local_90.fDumpNewFaults == 0) {
          pcVar7 = "no";
        }
        Abc_Print(-2,
                  "\t-n      : toggles dumping faults not detected by a given test set [default = %s]\n"
                  ,pcVar7);
        if (local_90.fVerbose == 0) {
          pcVar8 = "no";
        }
        Abc_Print(-2,"\t-v      : toggles printing verbose information [default = %s]\n",pcVar8);
        Abc_Print(-2,"\t-h      : print the command usage\n");
        Abc_Print(-2,"\t<file>  : (optional) file name with input test patterns\n\n");
        Abc_Print(-2,"\t-G file : (optional) file name with the golden model\n\n");
        Abc_Print(-2,"\t-S str  : (optional) string representing the fault model\n");
        Abc_Print(-2,"\t          The following notations are used:\n");
        Abc_Print(-2,"\t            Functional variables: {a,b} (both a and b are always present)\n"
                 );
        Abc_Print(-2,
                  "\t            Parameter variables: {p,q,r,s,t,u,v,w} (any number from 1 to 8)\n")
        ;
        Abc_Print(-2,"\t            Boolean operators: AND(&), OR(|), XOR(^), MUX(?:), NOT(~)\n");
        Abc_Print(-2,
                  "\t            Parentheses should be used around each operator. Spaces not allowed.\n"
                 );
        Abc_Print(-2,
                  "\t            Complement (~) is only allowed before variables (use DeMorgan law).\n"
                 );
        Abc_Print(-2,"\t            Examples:\n");
        Abc_Print(-2,"\t              (((a&b)&~p)|q)        stuck-at-0/1 at the output\n");
        Abc_Print(-2,"\t              (((a&~p)|q)&b)        stuck-at-0/1 at input a\n");
        Abc_Print(-2,
                  "\t              (((a|p)&(b|q))&~r)    stuck-at-1 at the inputs and stuck-at-0 at the output\n"
                 );
        Abc_Print(-2,
                  "\t              (((a&~p)&(b&~q))|r)   stuck-at-0 at the inputs and stuck-at-1 at the output\n"
                 );
        Abc_Print(-2,"\t              ((a&b)^p)             complement at the output\n");
        Abc_Print(-2,
                  "\t              (((a^p)&(b^q))^r)     complement at the inputs and at the output\n"
                 );
        Abc_Print(-2,
                  "\t              (a?(b?~s:r):(b?q:p))  functionally observable fault at the output\n"
                 );
        Abc_Print(-2,"\t              (p?(a|b):(a&b))       replace AND by OR\n");
        return 1;
      }
      goto LAB_0022f24f;
    case 0x53:
      if (globalUtilOptind < argc) {
        local_90.pFormStr = argv[globalUtilOptind];
LAB_0022f303:
        globalUtilOptind = globalUtilOptind + 1;
        goto LAB_0022f24f;
      }
      pcVar7 = "Command line switch \"-S\" should be followed by string.\n";
      break;
    case 0x54:
      if (globalUtilOptind < argc) {
        uVar5 = atoi(argv[globalUtilOptind]);
        local_90.nTimeOut = uVar5;
        goto LAB_0022f340;
      }
      pcVar7 = "Command line switch \"-T\" should be followed by an integer.\n";
    }
  }
LAB_0022f432:
  Abc_Print(-1,pcVar7);
  goto switchD_0022f274_caseD_63;
}

Assistant:

int Abc_CommandAbc9FFTest( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ParFfSetDefault( Bmc_ParFf_t * p );
    extern void Gia_ManFaultTest( Gia_Man_t * p, Gia_Man_t * pG, Bmc_ParFf_t * pPars );
    Bmc_ParFf_t Pars, * pPars = &Pars;
    char * pFileName = NULL;
    Gia_Man_t * pGold = NULL;
    int c;
    Gia_ParFfSetDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ATNKSGkbsfdeunvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->Algo = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Algo < 0 || pPars->Algo > 4 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterCheck = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterCheck < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nCardConstr = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCardConstr <= 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by string.\n" );
                goto usage;
            }
            pPars->pFormStr = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by string.\n" );
                goto usage;
            }
            pFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'k':
            pPars->fNonStrict ^= 1;
            break;
        case 'b':
            pPars->fBasic ^= 1;
            break;
        case 's':
            pPars->fStartPats ^= 1;
            break;
        case 'f':
            pPars->fFfOnly ^= 1;
            break;
        case 'd':
            pPars->fDump ^= 1;
            break;
        case 'e':
            pPars->fDumpDelay ^= 1;
            break;
        case 'u':
            pPars->fDumpUntest ^= 1;
            break;
        case 'n':
            pPars->fDumpNewFaults ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pPars->Algo == 0 && pPars->pFormStr == NULL )
    {
        Abc_Print( -1, "Formula string (-S <str>) should be selected when algorithm is 0 (-A 0).\n" );
        return 0;
    }
    if ( pPars->Algo != 0 && pPars->pFormStr != NULL )
    {
        Abc_Print( -1, "Algorithm should be 0 (-A 0) when formula string is selected (-S <str>).\n" );
        return 0;
    }
    // get the file name
    if ( argc == globalUtilOptind + 1 )
    {
        FILE * pFile;
        pPars->pFileName = argv[globalUtilOptind];
        pFile = fopen( pPars->pFileName, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Cannot open file \"%s\" with the input test patterns.\n", pPars->pFileName );
            return 0;
        }
        fclose( pFile );
    }
    // check other conditions
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9FFTest(): There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 && pPars->Algo == 1 )
    {
        Abc_Print( -1, "Abc_CommandAbc9FFTest(): For delay testing, AIG should be sequential.\n" );
        return 0;
    }
    // check if the file is valid
    if ( pFileName )
    {
        FILE * pFile = fopen( pFileName, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): File name \"%s\" with golden model is invalid.\n", pFileName );
            return 0;
        }
        fclose( pFile );
        pGold = Gia_AigerRead( pFileName, 0, 0 );
        if ( pGold == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): Cannot read file \"%s\" with golden model.\n", pFileName );
            return 0;
        }
        if ( Gia_ManPiNum(pAbc->pGia) != Gia_ManPiNum(pGold) )
        {
            Gia_ManStop( pGold );
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): Old model and gold model have different number of PIs.\n" );
            return 0;
        }
        if ( Gia_ManPoNum(pAbc->pGia) != Gia_ManPoNum(pGold) )
        {
            Gia_ManStop( pGold );
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): Old model and gold model have different number of POs.\n" );
            return 0;
        }
        printf( "Entered spec AIG from file \"%s\".\n", pFileName );
    }
    Gia_ManFaultTest( pAbc->pGia, pGold ? pGold : pAbc->pGia, pPars );
    Gia_ManStopP( &pGold );
    return 0;

usage:
    Abc_Print( -2, "usage: &fftest [-ATNK num] [-kbsfdeunvh] <file> [-G file] [-S str]\n" );
    Abc_Print( -2, "\t          performs functional fault test generation\n" );
    Abc_Print( -2, "\t-A num  : selects fault model for all gates [default = %d]\n", pPars->Algo );
    Abc_Print( -2, "\t                0: fault model is not selected (use -S str)\n" );
    Abc_Print( -2, "\t                1: delay fault testing for sequential circuits\n" );
    Abc_Print( -2, "\t                2: traditional stuck-at fault: -S (((a&b)&~p)|q)\n" );
    Abc_Print( -2, "\t                3: complement fault: -S ((a&b)^p)\n" );
    Abc_Print( -2, "\t                4: functionally observable fault\n" );
    Abc_Print( -2, "\t-T num  : specifies approximate runtime limit in seconds [default = %d]\n",        pPars->nTimeOut );
    Abc_Print( -2, "\t-N num  : specifies iteration to check for fixed parameters [default = %d]\n",     pPars->nIterCheck );
    Abc_Print( -2, "\t-K num  : specifies cardinality constraint (num > 0) [default = unused]\n" );
    Abc_Print( -2, "\t-k      : toggles non-strict cardinality (n <= K, instead of n == K) [default = %s]\n",pPars->fNonStrict?  "yes": "no" );
    Abc_Print( -2, "\t-b      : toggles testing for single faults (the same as \"-K 1\") [default = %s]\n", pPars->fBasic?      "yes": "no" );
    Abc_Print( -2, "\t-s      : toggles starting with the all-0 and all-1 patterns [default = %s]\n",    pPars->fStartPats?  "yes": "no" );
    Abc_Print( -2, "\t-f      : toggles faults at flop inputs only with \"-A 1\" and \"-S str\" [default = %s]\n",          pPars->fFfOnly?     "yes": "no" );
    Abc_Print( -2, "\t-d      : toggles dumping test patterns into file \"tests.txt\" [default = %s]\n", pPars->fDump?       "yes": "no" );
    Abc_Print( -2, "\t-e      : toggles dumping test pattern pairs (delay faults only) [default = %s]\n", pPars->fDumpDelay? "yes": "no" );
    Abc_Print( -2, "\t-u      : toggles dumping untestable faults into \"untest.txt\" [default = %s]\n", pPars->fDumpUntest? "yes": "no" );
    Abc_Print( -2, "\t-n      : toggles dumping faults not detected by a given test set [default = %s]\n", pPars->fDumpNewFaults? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggles printing verbose information [default = %s]\n",                  pPars->fVerbose?    "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    Abc_Print( -2, "\t<file>  : (optional) file name with input test patterns\n\n");
    Abc_Print( -2, "\t-G file : (optional) file name with the golden model\n\n");
    Abc_Print( -2, "\t-S str  : (optional) string representing the fault model\n");
    Abc_Print( -2, "\t          The following notations are used:\n");
    Abc_Print( -2, "\t            Functional variables: {a,b} (both a and b are always present)\n");
    Abc_Print( -2, "\t            Parameter variables: {p,q,r,s,t,u,v,w} (any number from 1 to 8)\n");
    Abc_Print( -2, "\t            Boolean operators: AND(&), OR(|), XOR(^), MUX(?:), NOT(~)\n");
    Abc_Print( -2, "\t            Parentheses should be used around each operator. Spaces not allowed.\n");
    Abc_Print( -2, "\t            Complement (~) is only allowed before variables (use DeMorgan law).\n");
    Abc_Print( -2, "\t            Examples:\n");
    Abc_Print( -2, "\t              (((a&b)&~p)|q)        stuck-at-0/1 at the output\n");
    Abc_Print( -2, "\t              (((a&~p)|q)&b)        stuck-at-0/1 at input a\n");
    Abc_Print( -2, "\t              (((a|p)&(b|q))&~r)    stuck-at-1 at the inputs and stuck-at-0 at the output\n");
    Abc_Print( -2, "\t              (((a&~p)&(b&~q))|r)   stuck-at-0 at the inputs and stuck-at-1 at the output\n");
    Abc_Print( -2, "\t              ((a&b)^p)             complement at the output\n");
    Abc_Print( -2, "\t              (((a^p)&(b^q))^r)     complement at the inputs and at the output\n");
    Abc_Print( -2, "\t              (a?(b?~s:r):(b?q:p))  functionally observable fault at the output\n");
    Abc_Print( -2, "\t              (p?(a|b):(a&b))       replace AND by OR\n");    
    return 1;
}